

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O2

void __thiscall UEFITool::goToData(UEFITool *this)

{
  UINT8 UVar1;
  bool bVar2;
  int iVar3;
  UINT32 UVar4;
  int iVar5;
  UINT32 UVar6;
  long *plVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  QModelIndex index;
  QByteArray rdata;
  QModelIndex currentIndex;
  QModelIndex parent;
  
  QAbstractItemView::selectionModel();
  QItemSelectionModel::currentIndex();
  if (((-1 < index.r) && (-1 < (long)index._0_8_)) && (index.m != (QAbstractItemModel *)0x0)) {
    UVar1 = TreeModel::type(this->model,&index);
    if (UVar1 == 'O') {
      UVar1 = TreeModel::subtype(this->model,&index);
      if (UVar1 == 0x84) {
        (**(code **)(*(long *)this->model + 0x68))(&parent,this->model,&index);
        iVar9 = index.r;
        iVar8 = index.r;
        while( true ) {
          iVar8 = iVar8 + 1;
          iVar3 = (**(code **)(*(long *)this->model + 0x78))(this->model,&parent);
          if (iVar3 <= iVar9) break;
          bVar2 = TreeModel::hasEmptyParsingData(this->model,&index);
          if (!bVar2) {
            TreeModel::parsingData(&rdata,this->model,&index);
            pcVar10 = rdata.d.ptr;
            UVar4 = TreeModel::offset(this->model,&index);
            if (pcVar10 == (char *)0x0) {
              pcVar10 = (char *)&QByteArray::_empty;
            }
            iVar3 = iVar8;
            if (*(int *)(pcVar10 + 4) == 0xffffff) {
              (**(code **)(**(long **)(this->ui + 0x130) + 0x1e8))
                        (*(long **)(this->ui + 0x130),&index,3);
              plVar7 = (long *)QAbstractItemView::selectionModel();
              (**(code **)(*plVar7 + 0x68))(plVar7,&index,0x23);
            }
            while( true ) {
              iVar5 = (**(code **)(*(long *)this->model + 0x78))(this->model,&parent);
              if (iVar5 <= iVar3) break;
              (**(code **)(*(long *)parent.m + 0x60))(&currentIndex,parent.m,iVar3,0,&parent);
              bVar2 = TreeModel::hasEmptyParsingData(this->model,&currentIndex);
              if (!bVar2) {
                UVar6 = TreeModel::offset(this->model,&currentIndex);
                if (UVar6 == *(int *)(pcVar10 + 4) + UVar4) {
                  index.m = currentIndex.m;
                  index.r = currentIndex.r;
                  index.c = currentIndex.c;
                  index.i = currentIndex.i;
                  break;
                }
              }
              iVar3 = iVar3 + 1;
            }
            QArrayDataPointer<char>::~QArrayDataPointer(&rdata.d);
          }
          iVar9 = iVar9 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void UEFITool::goToData()
{
    QModelIndex index = ui->structureTreeView->selectionModel()->currentIndex();
    if (!index.isValid() || model->type(index) != Types::NvarEntry || model->subtype(index) != Subtypes::LinkNvarEntry)
        return;
    
    // Get parent
    QModelIndex parent = model->parent(index);
    
    for (int i = index.row(); i < model->rowCount(parent); i++) {
        if (model->hasEmptyParsingData(index))
            continue;
        
        UByteArray rdata = model->parsingData(index);
        const NVAR_ENTRY_PARSING_DATA* pdata = (const NVAR_ENTRY_PARSING_DATA*)rdata.constData();
        UINT32 offset = model->offset(index);
        if (pdata->next == 0xFFFFFF) {
            ui->structureTreeView->scrollTo(index, QAbstractItemView::PositionAtCenter);
            ui->structureTreeView->selectionModel()->select(index, QItemSelectionModel::Select | QItemSelectionModel::Rows | QItemSelectionModel::Clear);
        }
        
        for (int j = i + 1; j < model->rowCount(parent); j++) {
            QModelIndex currentIndex = parent.model()->index(j, 0, parent);
            
            if (model->hasEmptyParsingData(currentIndex))
                continue;
            
            if (model->offset(currentIndex) == offset + pdata->next) {
                index = currentIndex;
                break;
            }
        }
    }
}